

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonIO.hh
# Opt level: O3

void __thiscall avro::json::JsonGenerator::encodeBool(JsonGenerator *this,bool b)

{
  size_t n;
  undefined7 in_register_00000031;
  char *b_00;
  
  sep(this);
  if ((int)CONCAT71(in_register_00000031,b) == 0) {
    b_00 = "false";
    n = 5;
  }
  else {
    b_00 = "true";
    n = 4;
  }
  StreamWriter::writeBytes(&this->out_,(uint8_t *)b_00,n);
  if (this->top == stKey) {
    this->top = stMapN;
  }
  return;
}

Assistant:

void encodeBool(bool b) {
        sep();
        if (b) {
            out_.writeBytes(reinterpret_cast<const uint8_t*>("true"), 4);
        } else {
            out_.writeBytes(reinterpret_cast<const uint8_t*>("false"), 5);
        }
        sep2();
    }